

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_pack_extension(nghttp2_session *session,nghttp2_bufs *bufs,nghttp2_frame *frame)

{
  nghttp2_buf_chain *pnVar1;
  ulong uVar2;
  ulong local_50;
  size_t framelen;
  size_t buflen;
  nghttp2_buf *buf;
  ssize_t rv;
  nghttp2_frame *frame_local;
  nghttp2_bufs *bufs_local;
  nghttp2_session *session_local;
  
  if ((session->callbacks).pack_extension_callback == (nghttp2_pack_extension_callback)0x0) {
    __assert_fail("session->callbacks.pack_extension_callback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x8e7,
                  "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)");
  }
  pnVar1 = bufs->head;
  if ((ulong)((long)(pnVar1->buf).end - (long)(pnVar1->buf).last) < 0x4000) {
    local_50 = (long)(pnVar1->buf).end - (long)(pnVar1->buf).last;
  }
  else {
    local_50 = 0x4000;
  }
  uVar2 = (*(session->callbacks).pack_extension_callback)
                    (session,(pnVar1->buf).last,local_50,frame,session->user_data);
  if (uVar2 == 0xfffffffffffffde9) {
    session_local._4_4_ = -0x217;
  }
  else if (((long)uVar2 < 0) || (local_50 < uVar2)) {
    session_local._4_4_ = -0x386;
  }
  else {
    (frame->hd).length = uVar2;
    if ((pnVar1->buf).pos != (pnVar1->buf).last) {
      __assert_fail("buf->pos == buf->last",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x8fa,
                    "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)"
                   );
    }
    (pnVar1->buf).last = (pnVar1->buf).last + uVar2;
    (pnVar1->buf).pos = (pnVar1->buf).pos + -9;
    nghttp2_frame_pack_frame_hd((pnVar1->buf).pos,&frame->hd);
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

static int session_pack_extension(nghttp2_session *session, nghttp2_bufs *bufs,
                                  nghttp2_frame *frame) {
  ssize_t rv;
  nghttp2_buf *buf;
  size_t buflen;
  size_t framelen;

  assert(session->callbacks.pack_extension_callback);

  buf = &bufs->head->buf;
  buflen = nghttp2_min(nghttp2_buf_avail(buf), NGHTTP2_MAX_PAYLOADLEN);

  rv = session->callbacks.pack_extension_callback(session, buf->last, buflen,
                                                  frame, session->user_data);
  if (rv == NGHTTP2_ERR_CANCEL) {
    return (int)rv;
  }

  if (rv < 0 || (size_t)rv > buflen) {
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  framelen = (size_t)rv;

  frame->hd.length = framelen;

  assert(buf->pos == buf->last);
  buf->last += framelen;
  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  return 0;
}